

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_constraint.hpp
# Opt level: O2

BoundCheckConstraint * __thiscall
duckdb::BoundConstraint::Cast<duckdb::BoundCheckConstraint>(BoundConstraint *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == CHECK) {
    return (BoundCheckConstraint *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Failed to cast constraint to type - bound constraint type mismatch",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast constraint to type - bound constraint type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}